

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_BracketInsert_Test<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_BracketInsert_Test<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type kVar2;
  value_type this_00;
  AssertHelper *this_01;
  long in_RDI;
  Hasher HVar3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TypeParam ht;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined4 in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa7c;
  AssertionResult *in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa98;
  int in_stack_fffffffffffffa9c;
  int line;
  HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffaa0;
  size_type in_stack_fffffffffffffaa8;
  Type TVar4;
  HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffac0;
  char *in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  char *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffafc;
  uint i;
  AssertHelper *in_stack_fffffffffffffb00;
  AssertHelper *this_02;
  Hasher local_458;
  int local_448;
  undefined4 local_444;
  AssertionResult local_440;
  value_type local_42c;
  undefined1 local_421;
  key_type local_420;
  Hasher local_408;
  Hasher local_3f8;
  int local_3e8;
  undefined4 local_3e4;
  AssertionResult local_3e0;
  value_type local_3cc;
  undefined1 local_3c1;
  key_type local_3c0;
  Hasher local_3a8;
  Hasher local_398;
  int local_388;
  undefined4 local_384;
  AssertionResult local_380;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_370;
  AssertHelper local_354;
  HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_348;
  string local_2c0 [48];
  value_type local_290;
  undefined1 local_285;
  key_type local_284;
  undefined1 local_279;
  AssertionResult local_278;
  string local_268 [48];
  value_type local_238;
  undefined1 local_22d;
  key_type local_22c;
  undefined1 local_221;
  AssertionResult local_220;
  value_type local_20c;
  undefined1 local_201;
  key_type local_200;
  string local_1f8 [48];
  value_type local_1c8;
  undefined1 local_1bd;
  key_type local_1bc;
  undefined1 local_1b1;
  AssertionResult local_1b0;
  string local_1a0 [48];
  const_iterator local_170;
  key_type local_150;
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_148;
  undefined1 local_121;
  AssertionResult local_120;
  value_type local_10c;
  undefined1 local_101;
  key_type local_100;
  string local_f8 [48];
  const_iterator local_c8;
  key_type local_a8;
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_a0;
  undefined1 local_79;
  AssertionResult local_78;
  string local_68 [67];
  undefined1 local_25;
  key_type local_24;
  undefined1 local_19;
  AssertionResult local_18;
  
  bVar1 = google::
          HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_brackets((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                               *)(in_RDI + 0x10));
  if (bVar1) {
    local_24 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                           (int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
    local_25 = google::
               HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::default_data((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                               *)(in_RDI + 0x10));
    local_19 = google::
               HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::bracket_equal<bool>
                         ((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                           *)in_stack_fffffffffffffac0,
                          (key_type *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                          (bool *)in_stack_fffffffffffffab0);
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffa80,
               (bool *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
               (type *)0xe03c13);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffab0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                 in_stack_fffffffffffffaf0,
                 (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                 in_stack_fffffffffffffae0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffab0,(Type)(in_stack_fffffffffffffaa8 >> 0x20)
                 ,(char *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
                 (char *)in_stack_fffffffffffffa90);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb00,
                 (Message *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa80);
      std::__cxx11::string::~string(local_68);
      testing::Message::~Message((Message *)0xe03cd4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe03d6b);
    local_a8 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                           (int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffac0,
           (key_type *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
    google::
    BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::end(in_stack_fffffffffffffac0);
    local_79 = google::
               dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator!=(&local_a0,&local_c8);
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffa80,
               (bool *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
               (type *)0xe03e01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffab0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                 in_stack_fffffffffffffaf0,
                 (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                 in_stack_fffffffffffffae0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffab0,(Type)(in_stack_fffffffffffffaa8 >> 0x20)
                 ,(char *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
                 (char *)in_stack_fffffffffffffa90);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb00,
                 (Message *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa80);
      std::__cxx11::string::~string(local_f8);
      testing::Message::~Message((Message *)0xe03ed4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe03f6b);
    local_100 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                            (int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
    local_10c = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),0);
    local_101 = google::
                HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)(in_RDI + 0x10),&local_10c);
    google::
    HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::bracket_assign<bool>
              (in_stack_fffffffffffffaa0,
               (key_type *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
               (bool *)in_stack_fffffffffffffa90);
    local_150 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                            (int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffac0,
           (key_type *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
    google::
    BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::end(in_stack_fffffffffffffac0);
    local_121 = google::
                dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::operator!=(&local_148,&local_170);
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffa80,
               (bool *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
               (type *)0xe0408e);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffab0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                 in_stack_fffffffffffffaf0,
                 (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                 in_stack_fffffffffffffae0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffab0,(Type)(in_stack_fffffffffffffaa8 >> 0x20)
                 ,(char *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
                 (char *)in_stack_fffffffffffffa90);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb00,
                 (Message *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa80);
      std::__cxx11::string::~string(local_1a0);
      testing::Message::~Message((Message *)0xe04161);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe041f8);
    local_1bc = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                            (int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
    local_1c8 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),0);
    local_1bd = google::
                HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)(in_RDI + 0x10),&local_1c8);
    local_1b1 = google::
                HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::bracket_equal<bool>
                          ((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffac0,
                           (key_type *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8)
                           ,(bool *)in_stack_fffffffffffffab0);
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffa80,
               (bool *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
               (type *)0xe042a7);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffab0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                 in_stack_fffffffffffffaf0,
                 (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                 in_stack_fffffffffffffae0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffab0,(Type)(in_stack_fffffffffffffaa8 >> 0x20)
                 ,(char *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
                 (char *)in_stack_fffffffffffffa90);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb00,
                 (Message *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa80);
      std::__cxx11::string::~string(local_1f8);
      testing::Message::~Message((Message *)0xe0437a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe04411);
    local_200 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                            (int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
    local_20c = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),0);
    local_201 = google::
                HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)(in_RDI + 0x10),&local_20c);
    google::
    HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::bracket_assign<bool>
              (in_stack_fffffffffffffaa0,
               (key_type *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
               (bool *)in_stack_fffffffffffffa90);
    local_22c = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                            (int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
    local_238 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),0);
    local_22d = google::
                HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)(in_RDI + 0x10),&local_238);
    local_221 = google::
                HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::bracket_equal<bool>
                          ((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffac0,
                           (key_type *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8)
                           ,(bool *)in_stack_fffffffffffffab0);
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffa80,
               (bool *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
               (type *)0xe0454d);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_220);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffab0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                 in_stack_fffffffffffffaf0,
                 (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                 in_stack_fffffffffffffae0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffab0,(Type)(in_stack_fffffffffffffaa8 >> 0x20)
                 ,(char *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
                 (char *)in_stack_fffffffffffffa90);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb00,
                 (Message *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa80);
      std::__cxx11::string::~string(local_268);
      testing::Message::~Message((Message *)0xe04620);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe046b7);
    local_284 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                            (int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
    local_290 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),0);
    local_285 = google::
                HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)(in_RDI + 0x10),&local_290);
    local_279 = google::
                HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::bracket_equal<bool>
                          ((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffac0,
                           (key_type *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8)
                           ,(bool *)in_stack_fffffffffffffab0);
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffa80,
               (bool *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
               (type *)0xe04766);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_278);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffab0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                 in_stack_fffffffffffffaf0,
                 (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                 in_stack_fffffffffffffae0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffab0,(Type)(in_stack_fffffffffffffaa8 >> 0x20)
                 ,(char *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
                 (char *)in_stack_fffffffffffffa90);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb00,
                 (Message *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa80);
      std::__cxx11::string::~string(local_2c0);
      testing::Message::~Message((Message *)0xe04839);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe048d0);
    this_02 = &local_354;
    i = 0;
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_370,i,(int *)(ulong)i);
    google::
    HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashSet
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
               (hasher *)in_stack_fffffffffffffaa0,
               (key_equal *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
               (allocator_type *)in_stack_fffffffffffffa90);
    TVar4 = (Type)(in_stack_fffffffffffffaa8 >> 0x20);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_370);
    local_384 = 0;
    local_3a8 = (Hasher)google::
                        BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        ::hash_funct(in_stack_fffffffffffffa90);
    local_398 = local_3a8;
    local_388 = Hasher::num_hashes(&local_398);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
               (char *)in_stack_fffffffffffffa90,
               (int *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               (int *)in_stack_fffffffffffffa80);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_380);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffab0);
      testing::AssertionResult::failure_message((AssertionResult *)0xe04a80);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffab0,TVar4,(char *)in_stack_fffffffffffffaa0,
                 in_stack_fffffffffffffa9c,(char *)in_stack_fffffffffffffa90);
      testing::internal::AssertHelper::operator=
                (this_02,(Message *)CONCAT44(i,in_stack_fffffffffffffaf8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa80);
      testing::Message::~Message((Message *)0xe04add);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe04b4e);
    local_3c0 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                            (int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
    local_3cc = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),0);
    local_3c1 = google::
                HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data(&local_348,&local_3cc);
    google::
    HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::bracket_assign<bool>
              (in_stack_fffffffffffffaa0,
               (key_type *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
               (bool *)in_stack_fffffffffffffa90);
    local_3e4 = 1;
    local_408 = (Hasher)google::
                        BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        ::hash_funct(in_stack_fffffffffffffa90);
    local_3f8 = local_408;
    local_3e8 = Hasher::num_hashes(&local_3f8);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
               (char *)in_stack_fffffffffffffa90,
               (int *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               (int *)in_stack_fffffffffffffa80);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffab0);
      in_stack_fffffffffffffab0 =
           (HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xe04cc1);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffab0,TVar4,(char *)in_stack_fffffffffffffaa0,
                 in_stack_fffffffffffffa9c,(char *)in_stack_fffffffffffffa90);
      testing::internal::AssertHelper::operator=
                (this_02,(Message *)CONCAT44(i,in_stack_fffffffffffffaf8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa80);
      testing::Message::~Message((Message *)0xe04d1e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe04d8f);
    kVar2 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                        (int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
    local_420 = kVar2;
    this_00 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),0);
    TVar4 = kVar2.second;
    local_42c = this_00;
    local_421 = google::
                HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data(&local_348,&local_42c);
    line = CONCAT13(local_421,(int3)in_stack_fffffffffffffa9c);
    google::
    HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::bracket_assign<bool>
              ((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_00,(key_type *)CONCAT44(line,in_stack_fffffffffffffa98),
               (bool *)in_stack_fffffffffffffa90);
    local_444 = 2;
    HVar3 = (Hasher)google::
                    BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ::hash_funct(in_stack_fffffffffffffa90);
    local_458 = HVar3;
    local_448 = Hasher::num_hashes(&local_458);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(line,in_stack_fffffffffffffa98),HVar3._0_8_,
               (int *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffffa88),
               (int *)in_stack_fffffffffffffa80);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_440);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffab0);
      this_01 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0xe04f02);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffab0,TVar4,(char *)this_00,line,HVar3._0_8_);
      testing::internal::AssertHelper::operator=
                (this_02,(Message *)CONCAT44(i,in_stack_fffffffffffffaf8));
      testing::internal::AssertHelper::~AssertHelper(this_01);
      testing::Message::~Message((Message *)0xe04f5f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe04fca);
    google::
    HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashSet
              ((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xe04fd7);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BracketInsert) {
  // tests operator[], for those types that support it.
  if (!this->ht_.supports_brackets()) return;

  // bracket_equal is equivalent to ht_[a] == b.  It should insert a if
  // it doesn't already exist.
  EXPECT_TRUE(
      this->ht_.bracket_equal(this->UniqueKey(1), this->ht_.default_data()));
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) != this->ht_.end());

  // bracket_assign is equivalent to ht_[a] = b.
  this->ht_.bracket_assign(this->UniqueKey(2),
                           this->ht_.get_data(this->UniqueObject(4)));
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(2)) != this->ht_.end());
  EXPECT_TRUE(this->ht_.bracket_equal(
      this->UniqueKey(2), this->ht_.get_data(this->UniqueObject(4))));

  this->ht_.bracket_assign(this->UniqueKey(2),
                           this->ht_.get_data(this->UniqueObject(6)));
  EXPECT_TRUE(this->ht_.bracket_equal(
      this->UniqueKey(2), this->ht_.get_data(this->UniqueObject(6))));
  // bracket_equal shouldn't have modified the value.
  EXPECT_TRUE(this->ht_.bracket_equal(
      this->UniqueKey(2), this->ht_.get_data(this->UniqueObject(6))));

  // Verify that an operator[] that doesn't cause a resize, also
  // doesn't require an extra rehash.
  TypeParam ht(100);
  EXPECT_EQ(0, ht.hash_funct().num_hashes());
  ht.bracket_assign(this->UniqueKey(2), ht.get_data(this->UniqueObject(2)));
  EXPECT_EQ(1, ht.hash_funct().num_hashes());

  // And overwriting, likewise, should only cause one extra hash.
  ht.bracket_assign(this->UniqueKey(2), ht.get_data(this->UniqueObject(2)));
  EXPECT_EQ(2, ht.hash_funct().num_hashes());
}